

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

LY_ERR yin_parse_mod(lysp_yin_ctx *ctx,lysp_module *mod)

{
  lysp_submodule *plVar1;
  undefined8 in_stack_fffffffffffffc28;
  undefined4 uVar2;
  ly_ctx *local_130;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  size_t subelems_size;
  lysp_submodule *dup;
  yin_subelement *subelems;
  lysp_module *plStack_48;
  LY_ERR ret;
  lysp_module *mod_local;
  lysp_yin_ctx *ctx_local;
  
  uVar2 = (undefined4)((ulong)in_stack_fffffffffffffc28 >> 0x20);
  subelems._4_4_ = 0;
  dup = (lysp_submodule *)0x0;
  mod->field_0x79 = mod->field_0x79 & 0xfd;
  plStack_48 = mod;
  mod_local = (lysp_module *)ctx;
  ctx_local._4_4_ = lyxml_ctx_next(ctx->xmlctx);
  if (((ctx_local._4_4_ == LY_SUCCESS) &&
      (ctx_local._4_4_ =
            yin_parse_attribute((lysp_yin_ctx *)mod_local,YIN_ARG_NAME,&plStack_48->mod->name,
                                Y_IDENTIF_ARG,LY_STMT_MODULE), ctx_local._4_4_ == LY_SUCCESS)) &&
     (ctx_local._4_4_ =
           subelems_allocator((lysp_yin_ctx *)mod_local,0x1c,(lysp_node *)0x0,
                              (yin_subelement **)&dup,0x20,&plStack_48->data,CONCAT44(uVar2,8),0x40,
                              &plStack_48->data,0,0x80,&plStack_48->augments,0,0x200,
                              &plStack_48->data,0,0x60000,&plStack_48->mod->contact,2,0x400,
                              &plStack_48->data,0,0x80000,&plStack_48->mod->dsc,2,0xa0000,
                              &plStack_48->deviations,0,0xe0000,&plStack_48->extensions,0,0x100000,
                              &plStack_48->features,0,0x800,&plStack_48->groupings,0,0x120000,
                              &plStack_48->identities,0,0x140000,plStack_48->mod->prefix,
                              &plStack_48->imports,0,0x150000,plStack_48->mod->name,
                              &plStack_48->includes,0,0x1000,&plStack_48->data,0,0x2000,
                              &plStack_48->data,0,0x4000,&plStack_48->data,0,0x1e0000,
                              &plStack_48->mod->ns,3,1,&plStack_48->notifs,0,0x200000,
                              &plStack_48->mod->org,2,0x240000,&plStack_48->mod->prefix,3),
     ctx_local._4_4_ == LY_SUCCESS)) {
    subelems._4_4_ =
         yin_parse_content((lysp_yin_ctx *)mod_local,(yin_subelement *)dup,0x1c,plStack_48,
                           LY_STMT_MODULE,(char **)0x0,&plStack_48->exts);
    subelems_deallocator(0x1c,(yin_subelement *)dup);
    if (subelems._4_4_ == LY_SUCCESS) {
      ctx_local._4_4_ = yin_unres_exts_add((lysp_yin_ctx *)mod_local,plStack_48->exts);
      if (ctx_local._4_4_ == LY_SUCCESS) {
        plVar1 = ly_ctx_get_submodule_latest
                           ((ly_ctx *)mod_local->data->parent,plStack_48->mod->name);
        if (plVar1 == (lysp_submodule *)0x0) {
          ctx_local._4_4_ = LY_SUCCESS;
        }
        else {
          if (mod_local == (lysp_module *)0x0) {
            local_130 = (ly_ctx *)0x0;
          }
          else {
            local_130 = *(ly_ctx **)
                         **(undefined8 **)
                           (mod_local->typedefs->units +
                           (ulong)(*(int *)((long)&mod_local->typedefs->name + 4) - 1) * 8);
          }
          ly_vlog(local_130,(char *)0x0,LYVE_SEMANTICS,
                  "Name collision between %s and %s of name \"%s\".","module","submodule",
                  plStack_48->mod->name);
          ctx_local._4_4_ = LY_EVALID;
        }
      }
    }
    else {
      ctx_local._4_4_ = subelems._4_4_;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

LY_ERR
yin_parse_mod(struct lysp_yin_ctx *ctx, struct lysp_module *mod)
{
    LY_ERR ret = LY_SUCCESS;
    struct yin_subelement *subelems = NULL;
    const struct lysp_submodule *dup;
    size_t subelems_size;

    mod->is_submod = 0;

    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_NAME, &mod->mod->name, Y_IDENTIF_ARG, LY_STMT_MODULE));
    LY_CHECK_RET(subelems_allocator(ctx, subelems_size = 28, NULL, &subelems,
            LY_STMT_ANYDATA, &mod->data, YIN_SUBELEM_VER2,
            LY_STMT_ANYXML, &mod->data, 0,
            LY_STMT_AUGMENT, &mod->augments, 0,
            LY_STMT_CHOICE, &mod->data, 0,
            LY_STMT_CONTACT, &mod->mod->contact, YIN_SUBELEM_UNIQUE,
            LY_STMT_CONTAINER, &mod->data, 0,
            LY_STMT_DESCRIPTION, &mod->mod->dsc, YIN_SUBELEM_UNIQUE,
            LY_STMT_DEVIATION, &mod->deviations, 0,
            LY_STMT_EXTENSION, &mod->extensions, 0,
            LY_STMT_FEATURE, &mod->features, 0,
            LY_STMT_GROUPING, &mod->groupings, 0,
            LY_STMT_IDENTITY, &mod->identities, 0,
            LY_STMT_IMPORT, mod->mod->prefix, &mod->imports, 0,
            LY_STMT_INCLUDE, mod->mod->name, &mod->includes, 0,
            LY_STMT_LEAF, &mod->data, 0,
            LY_STMT_LEAF_LIST, &mod->data, 0,
            LY_STMT_LIST, &mod->data, 0,
            LY_STMT_NAMESPACE, &mod->mod->ns, YIN_SUBELEM_MANDATORY | YIN_SUBELEM_UNIQUE,
            LY_STMT_NOTIFICATION, &mod->notifs, 0,
            LY_STMT_ORGANIZATION, &mod->mod->org, YIN_SUBELEM_UNIQUE,
            LY_STMT_PREFIX, &mod->mod->prefix, YIN_SUBELEM_MANDATORY | YIN_SUBELEM_UNIQUE,
            LY_STMT_REFERENCE, &mod->mod->ref, YIN_SUBELEM_UNIQUE,
            LY_STMT_REVISION, &mod->revs, 0,
            LY_STMT_RPC, &mod->rpcs, 0,
            LY_STMT_TYPEDEF, &mod->typedefs, 0,
            LY_STMT_USES, &mod->data, 0,
            LY_STMT_YANG_VERSION, &mod->version, YIN_SUBELEM_UNIQUE,
            LY_STMT_EXTENSION_INSTANCE, NULL, 0));

    ret = yin_parse_content(ctx, subelems, subelems_size, mod, LY_STMT_MODULE, NULL, &mod->exts);
    subelems_deallocator(subelems_size, subelems);
    LY_CHECK_RET(ret);

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, mod->exts));

    /* submodules share the namespace with the module names, so there must not be
     * a submodule of the same name in the context, no need for revision matching */
    dup = ly_ctx_get_submodule_latest(ctx->xmlctx->ctx, mod->mod->name);
    if (dup) {
        LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_NAME2_COL, "module", "submodule", mod->mod->name);
        return LY_EVALID;
    }

    return LY_SUCCESS;
}